

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_merge(kvtree *hash1,kvtree *hash2)

{
  char *key;
  int iVar1;
  kvtree_elem *pkVar2;
  kvtree *hash_value;
  kvtree_struct *hash1_00;
  int iVar3;
  kvtree_elem_struct *pkVar4;
  
  if (hash1 == (kvtree *)0x0) {
    iVar3 = 1;
  }
  else {
    iVar3 = 0;
    if ((hash2 != (kvtree *)0x0) &&
       (pkVar4 = hash2->lh_first, iVar3 = 0, pkVar4 != (kvtree_elem_struct *)0x0)) {
      iVar3 = 0;
      do {
        key = pkVar4->key;
        pkVar2 = kvtree_elem_get(hash1,key);
        if (pkVar2 == (kvtree_elem *)0x0) {
          hash1_00 = (kvtree_struct *)0x0;
        }
        else {
          hash1_00 = pkVar2->hash;
        }
        if (hash1_00 == (kvtree_struct *)0x0) {
          hash_value = (kvtree *)
                       kvtree_malloc(8,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                     ,0x47);
          hash_value->lh_first = (kvtree_elem_struct *)0x0;
          hash1_00 = kvtree_set(hash1,key,hash_value);
        }
        iVar1 = kvtree_merge(hash1_00,pkVar4->hash);
        if (iVar1 != 0) {
          iVar3 = 1;
        }
        pkVar4 = (pkVar4->pointers).le_next;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
    }
  }
  return iVar3;
}

Assistant:

int kvtree_merge(kvtree* hash1, const kvtree* hash2)
{
  /* need hash1 to be valid to insert anything into it */
  if (hash1 == NULL) {
    return KVTREE_FAILURE;
  }

  /* if hash2 is NULL, there is nothing to insert, so we're done */
  if (hash2 == NULL) {
    return KVTREE_SUCCESS;
  }

  int rc = KVTREE_SUCCESS;

  /* iterate over the elements in hash2 */
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(hash2);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get the key for this element */
    char* key = kvtree_elem_key(elem);

    /* get hash for the matching element in hash1, if it has one */
    kvtree* key_hash1 = kvtree_get(hash1, key);
    if (key_hash1 == NULL) {
      /* hash1 had no element with this key, so create one */
      key_hash1 = kvtree_set(hash1, key, kvtree_new());
    }

    /* merge the hash for this key from hash2 with the hash for this
     * key from hash1 */
    kvtree* key_hash2 = kvtree_elem_hash(elem);
    if (kvtree_merge(key_hash1, key_hash2) != KVTREE_SUCCESS) {
      rc = KVTREE_FAILURE;
    }
  }

  return rc;
}